

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 456.test.cpp
# Opt level: O2

void verifyChunkLNU1(Type<1,_456> *chunk)

{
  Type<1,_456> *this;
  variant_alternative_t<0UL,_variant<PolynomialMultiplicity,_TabulatedMultiplicity>_> *pvVar1;
  long lVar2;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  double local_e0;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_58;
  double *local_48;
  WithinRelMatcher *local_40;
  Type<1,_456> *local_38;
  
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd3;
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "456 == chunk.MT()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d8,capturedExpression,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 0x1c8;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0x1c8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd4;
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "456 == chunk.sectionNumber()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d8,capturedExpression_00,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 0x1c8;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 0x1c8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd5;
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "92235 == chunk.ZA()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d8,capturedExpression_01,
             ContinueOnFailure);
  local_c0[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).ZA_;
  local_d0._1_1_ = local_c0[0]._8_4_ == 0x1684b;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 0x1684b;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd6;
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "92235 == chunk.targetIdentifier()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d8,capturedExpression_02,
             ContinueOnFailure);
  local_c0[0]._8_4_ = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).ZA_;
  local_d0._1_1_ = local_c0[0]._8_4_ == 0x1684b;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 0x1684b;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd7;
  capturedExpression_03.m_size = 0x30;
  capturedExpression_03.m_start = "233.0248, WithinRel( chunk.atomicWeightRatio() )";
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d8,capturedExpression_03,
             ContinueOnFailure);
  local_e0 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).atomicWeightRatio_);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd8;
  capturedExpression_04.m_size = 0x22;
  capturedExpression_04.m_start = "233.0248, WithinRel( chunk.AWR() )";
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d8,capturedExpression_04,
             ContinueOnFailure);
  local_e0 = 233.0248;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_456>_>).atomicWeightRatio_);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xd9;
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "1 == chunk.LNU()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d8,capturedExpression_05,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_456>::LNU(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 1;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xda;
  capturedExpression_06.m_size = 0x1b;
  capturedExpression_06.m_start = "1 == chunk.representation()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d8,capturedExpression_06,
             ContinueOnFailure);
  local_c0[0]._8_4_ = njoy::ENDFtk::section::Type<1,_456>::LNU(chunk);
  local_d0._1_1_ = local_c0[0]._8_4_ == 1;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_38 = chunk;
  pvVar1 = std::
           get<0ul,njoy::ENDFtk::section::PolynomialMultiplicity,njoy::ENDFtk::section::TabulatedMultiplicity>
                     (&chunk->data_);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xde;
  capturedExpression_07.m_size = 0x10;
  capturedExpression_07.m_start = "1 == nubar.LNU()";
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d8,capturedExpression_07,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xdf;
  capturedExpression_08.m_size = 0x1b;
  capturedExpression_08.m_start = "1 == nubar.representation()";
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d8,capturedExpression_08,
             ContinueOnFailure);
  local_d0._0_2_ = 0x101;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  local_c0[0]._8_4_ = 1;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe1;
  capturedExpression_09.m_size = 0x10;
  capturedExpression_09.m_start = "2 == nubar.NCO()";
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d8,capturedExpression_09,
             ContinueOnFailure);
  local_c0[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(pvVar1->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pvVar1->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_d0._1_1_ = local_c0[0]._8_4_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe2;
  capturedExpression_10.m_size = 0x1f;
  capturedExpression_10.m_start = "2 == nubar.numberCoefficients()";
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_d8,capturedExpression_10,
             ContinueOnFailure);
  local_c0[0]._8_4_ =
       (undefined4)
       ((ulong)((long)(pvVar1->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(pvVar1->super_ListRecord).data.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  local_d0._1_1_ = local_c0[0]._8_4_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d5328;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe3;
  capturedExpression_11.m_size = 0x15;
  capturedExpression_11.m_start = "2 == nubar.C().size()";
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_d8,capturedExpression_11,
             ContinueOnFailure);
  lVar2 = (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x10;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d53a8;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe4;
  capturedExpression_12.m_size = 0x20;
  capturedExpression_12.m_start = "2 == nubar.coefficients().size()";
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_d8,capturedExpression_12,
             ContinueOnFailure);
  lVar2 = (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar2 >> 3;
  local_d0._1_1_ = lVar2 == 0x10;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d53a8;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe5;
  capturedExpression_13.m_size = 0x21;
  capturedExpression_13.m_start = "2.4367, WithinRel( nubar.C()[0] )";
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_d8,capturedExpression_13,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe6;
  capturedExpression_14.m_size = 0x1f;
  capturedExpression_14.m_start = "5e-2, WithinRel( nubar.C()[1] )";
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_d8,capturedExpression_14,
             ContinueOnFailure);
  local_e0 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe7;
  capturedExpression_15.m_size = 0x2c;
  capturedExpression_15.m_start = "2.4367, WithinRel( nubar.coefficients()[0] )";
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_d8,capturedExpression_15,
             ContinueOnFailure);
  local_e0 = 2.4367;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             *(pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  this = local_38;
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xe8;
  capturedExpression_16.m_size = 0x2a;
  capturedExpression_16.m_start = "5e-2, WithinRel( nubar.coefficients()[1] )";
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_d8,capturedExpression_16,
             ContinueOnFailure);
  local_e0 = 0.05;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (pvVar1->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_58.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_e0);
  local_58.m_isBinaryExpression = true;
  local_58._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d5368;
  local_48 = &local_e0;
  local_40 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_58);
  Catch::ITransientExpression::~ITransientExpression(&local_58);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x18548c;
  local_d0 = (pointer)0xea;
  capturedExpression_17.m_size = 0xf;
  capturedExpression_17.m_start = "3 == chunk.NC()";
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_d8,capturedExpression_17,
             ContinueOnFailure);
  local_c0[0]._8_8_ = njoy::ENDFtk::section::Type<1,_456>::NC(this);
  local_d0._1_1_ = local_c0[0]._8_8_ == 3;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d53e8;
  local_d0._4_4_ = 3;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunkLNU1( const section::Type< 1, 456 >& chunk ) {

  CHECK( 456 == chunk.MT() );
  CHECK( 456 == chunk.sectionNumber() );
  CHECK( 92235 == chunk.ZA() );
  CHECK( 92235 == chunk.targetIdentifier() );
  CHECK_THAT( 233.0248, WithinRel( chunk.atomicWeightRatio() ) );
  CHECK_THAT( 233.0248, WithinRel( chunk.AWR() ) );
  CHECK( 1 == chunk.LNU() );
  CHECK( 1 == chunk.representation() );

  const auto& nubar = std::get< PolynomialMultiplicity >( chunk.nubar() );

  CHECK( 1 == nubar.LNU() );
  CHECK( 1 == nubar.representation() );

  CHECK( 2 == nubar.NCO() );
  CHECK( 2 == nubar.numberCoefficients() );
  CHECK( 2 == nubar.C().size() );
  CHECK( 2 == nubar.coefficients().size() );
  CHECK_THAT( 2.4367, WithinRel( nubar.C()[0] ) );
  CHECK_THAT( 5e-2, WithinRel( nubar.C()[1] ) );
  CHECK_THAT( 2.4367, WithinRel( nubar.coefficients()[0] ) );
  CHECK_THAT( 5e-2, WithinRel( nubar.coefficients()[1] ) );

  CHECK( 3 == chunk.NC() );
}